

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpServer.cpp
# Opt level: O2

void __thiscall FIX::HttpServer::onConfigure(HttpServer *this,SessionSettings *s)

{
  int iVar1;
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"HttpAcceptPort",&local_39)
  ;
  iVar1 = Dictionary::getInt(&s->m_defaults,&local_38);
  this->m_port = iVar1;
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void HttpServer::onConfigure( const SessionSettings& s )
EXCEPT ( ConfigError )
{
  m_port = s.get().getInt( HTTP_ACCEPT_PORT );
}